

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O1

void __thiscall booster::locale::calendar::calendar(calendar *this,calendar *other)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  
  std::locale::locale(&this->locale_,&other->locale_);
  (this->tz_)._M_dataplus._M_p = (pointer)&(this->tz_).field_2;
  pcVar1 = (other->tz_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->tz_,pcVar1,pcVar1 + (other->tz_)._M_string_length);
  iVar2 = (**((other->impl_).ptr_)->_vptr_abstract_calendar)();
  (this->impl_).ptr_ = (abstract_calendar *)CONCAT44(extraout_var,iVar2);
  return;
}

Assistant:

calendar::calendar(calendar const &other) :
    locale_(other.locale_),
    tz_(other.tz_),
    impl_(other.impl_->clone())
{
}